

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Region.cpp
# Opt level: O3

Region * Region::New(RegionType type,Region *parent,Func *func)

{
  Region *pRVar1;
  LabelInstr *pLVar2;
  undefined7 in_register_00000039;
  
  pRVar1 = (Region *)new<Memory::JitArenaAllocator>(0x70,func->m_alloc,0x3eba5c);
  pRVar1->matchingTryRegion = (Region *)0x0;
  pRVar1->matchingCatchRegion = (Region *)0x0;
  pRVar1->matchingFinallyOnExceptRegion = (Region *)0x0;
  pRVar1->matchingFinallyOnNoExceptRegion = (Region *)0x0;
  pRVar1->selfOrFirstTryAncestor = (Region *)0x0;
  pRVar1->start = (Instr *)0x0;
  pRVar1->end = (Instr *)0x0;
  pRVar1->exceptionObjectSym = (StackSym *)0x0;
  pRVar1->bailoutReturnThunkLabel = (LabelInstr *)0x0;
  pRVar1->writeThroughSymbolsSet = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  *(undefined8 *)((long)&pRVar1->writeThroughSymbolsSet + 1) = 0;
  *(undefined8 *)((long)&pRVar1->ehBailoutData + 1) = 0;
  pRVar1->type = type;
  pRVar1->parent = parent;
  pLVar2 = IR::LabelInstr::New(Label,func,true);
  pRVar1->bailoutReturnThunkLabel = pLVar2;
  if ((int)CONCAT71(in_register_00000039,type) == 2) {
    pRVar1->selfOrFirstTryAncestor = pRVar1;
  }
  return pRVar1;
}

Assistant:

Region *
Region::New(RegionType type, Region * parent, Func * func)
{
    Region * region = JitAnew(func->m_alloc, Region);

    region->type = type;
    region->parent = parent;
    region->bailoutReturnThunkLabel = IR::LabelInstr::New(Js::OpCode::Label, func, true);
    if (type == RegionTypeTry)
    {
        region->selfOrFirstTryAncestor = region;
    }
    return region;
}